

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O0

bool __thiscall GF2::MM<9UL>::Calc(MM<9UL> *this,WW<9UL> *val)

{
  bool bVar1;
  word wVar2;
  WW<9UL> *in_RSI;
  ulong *in_RDI;
  size_t pos;
  
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return true;
    }
    wVar2 = WW<9UL>::GetWord(in_RSI,0);
    if ((wVar2 | *in_RDI ^ 0xffffffffffffffff) != 0xffffffffffffffff) break;
    bVar1 = true;
  }
  return false;
}

Assistant:

bool Calc(const WW<_n>& val) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if ((val.GetWord(pos) | ~_words[pos]) != WORD_MAX)
				return false;
		return true;
	}